

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void Node_fprint(FILE *stream,Node *node)

{
  char *__format;
  int __c;
  char *pcVar1;
  Node *pNVar2;
  int iStack_40;
  
LAB_00104393:
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x132,"void Node_fprint(FILE *, Node *)");
  }
  __c = 0x21;
  switch(node->type) {
  case 1:
    pcVar1 = (node->rule).name;
    goto LAB_00104499;
  default:
    fprintf((FILE *)stream,"\nunknown node type %d\n");
    exit(1);
  case 3:
    pcVar1 = *(char **)((node->rule).name + 0x18);
LAB_00104499:
    __format = " %s";
    break;
  case 4:
    pcVar1 = " .";
    goto LAB_0010451e;
  case 5:
    pcVar1 = (node->rule).name;
    __format = " \'%s\'";
    break;
  case 6:
    pcVar1 = (node->rule).name;
    __format = " \"%s\"";
    break;
  case 7:
    pcVar1 = (node->rule).name;
    __format = " [%s]";
    break;
  case 8:
    pcVar1 = (node->rule).name;
    __format = " { %s }";
    break;
  case 9:
    pcVar1 = (node->rule).name;
    __format = " ?{ %s }";
    break;
  case 10:
    pNVar2 = (node->name).rule;
    fwrite(" (",2,1,(FILE *)stream);
    Node_fprint(stream,pNVar2);
    while (pNVar2 = (pNVar2->rule).next, pNVar2 != (Node *)0x0) {
      fwrite(" |",2,1,(FILE *)stream);
      Node_fprint(stream,pNVar2);
    }
    goto LAB_00104517;
  case 0xb:
    pNVar2 = (node->name).rule;
    fwrite(" (",2,1,(FILE *)stream);
    do {
      Node_fprint(stream,pNVar2);
      pNVar2 = (pNVar2->rule).next;
    } while (pNVar2 != (Node *)0x0);
LAB_00104517:
    pcVar1 = " )";
LAB_0010451e:
    fwrite(pcVar1,2,1,(FILE *)stream);
    return;
  case 0xc:
    __c = 0x26;
  case 0xd:
    goto switchD_001043b4_caseD_d;
  case 0xe:
    Node_fprint(stream,(node->name).rule);
    iStack_40 = 0x3f;
    goto LAB_001044d3;
  case 0xf:
    Node_fprint(stream,(node->name).rule);
    iStack_40 = 0x2a;
    goto LAB_001044d3;
  case 0x10:
    Node_fprint(stream,(node->name).rule);
    iStack_40 = 0x2b;
LAB_001044d3:
    fputc(iStack_40,(FILE *)stream);
    return;
  }
  fprintf((FILE *)stream,__format,pcVar1);
  return;
switchD_001043b4_caseD_d:
  fputc(__c,(FILE *)stream);
  node = (Node *)(node->rule).name;
  goto LAB_00104393;
}

Assistant:

static void Node_fprint(FILE *stream, Node *node)
{
  assert(node);
  switch (node->type)
    {
    case Rule:		fprintf(stream, " %s", node->rule.name);				break;
    case Name:		fprintf(stream, " %s", node->name.rule->rule.name);			break;
    case Dot:		fprintf(stream, " .");							break;
    case Character:	fprintf(stream, " '%s'", node->character.value);			break;
    case String:	fprintf(stream, " \"%s\"", node->string.value);				break;
    case Class:		fprintf(stream, " [%s]", node->cclass.value);				break;
    case Action:	fprintf(stream, " { %s }", node->action.text);				break;
    case Predicate:	fprintf(stream, " ?{ %s }", node->action.text);				break;

    case Alternate:	node= node->alternate.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  {
			    fprintf(stream, " |");
			    Node_fprint(stream, node);
			  }
			fprintf(stream, " )");
			break;

    case Sequence:	node= node->sequence.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  Node_fprint(stream, node);
			fprintf(stream, " )");
			break;

    case PeekFor:	fprintf(stream, "&");  Node_fprint(stream, node->query.element);	break;
    case PeekNot:	fprintf(stream, "!");  Node_fprint(stream, node->query.element);	break;
    case Query:		Node_fprint(stream, node->query.element);  fprintf(stream, "?");	break;
    case Star:		Node_fprint(stream, node->query.element);  fprintf(stream, "*");	break;
    case Plus:		Node_fprint(stream, node->query.element);  fprintf(stream, "+");	break;
    default:
      fprintf(stream, "\nunknown node type %d\n", node->type);
      exit(1);
    }
}